

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::AppendExpr
          (BinaryReaderIR *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *expr)

{
  char *__s;
  size_t sVar1;
  Expr *pEVar2;
  pointer pLVar3;
  pointer pLVar4;
  intrusive_list_base<wabt::Expr> *piVar5;
  Expr *pEVar6;
  Enum EVar7;
  size_t sVar8;
  long lVar9;
  long extraout_RAX;
  intrusive_list_base<wabt::Expr> *piVar10;
  
  __s = this->filename_;
  sVar8 = strlen(__s);
  sVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pEVar2 = (expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (pEVar2->loc).filename._M_len = sVar8;
  *(char **)((long)&(pEVar2->loc).filename + 8) = __s;
  (pEVar2->loc).field_1.field_1.offset = sVar1;
  *(undefined8 *)((long)&(pEVar2->loc).field_1 + 8) = 0;
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pLVar4 - (long)pLVar3;
  if (lVar9 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
    lVar9 = extraout_RAX;
  }
  else {
    lVar9 = (long)pLVar3 + lVar9 + -0x18;
  }
  if (pLVar4 == pLVar3) {
    EVar7 = Error;
  }
  else {
    piVar5 = *(intrusive_list_base<wabt::Expr> **)(lVar9 + 8);
    pEVar2 = (expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
    if (((pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       ((pEVar2->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x1bd,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar6 = piVar5->prev_;
    piVar10 = piVar5;
    if (pEVar6 != (Expr *)0x0) {
      (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar6;
      piVar10 = &pEVar6->super_intrusive_list_base<wabt::Expr>;
    }
    piVar10->next_ = pEVar2;
    piVar5->prev_ = pEVar2;
    (((Location *)(piVar5 + 1))->filename)._M_len =
         (((Location *)(piVar5 + 1))->filename)._M_len + 1;
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderIR::AppendExpr(std::unique_ptr<Expr> expr) {
  expr->loc = GetLocation();
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  label->exprs->push_back(std::move(expr));
  return Result::Ok;
}